

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O0

ps_config_t * ps_config_parse_json(ps_config_t *config,char *json)

{
  bool bVar1;
  uint num_tokens;
  uint uVar2;
  size_t sVar3;
  anytype_t *paVar4;
  int new_config;
  int ntok;
  int jslen;
  int i;
  char *val;
  char *key;
  jsmntok_t *tokens;
  jsmn_parser parser;
  char *json_local;
  ps_config_t *config_local;
  
  key = (char *)0x0;
  val = (char *)0x0;
  _jslen = (char *)0x0;
  bVar1 = false;
  if (json != (char *)0x0) {
    parser._4_8_ = json;
    json_local = (char *)config;
    if (config == (ps_config_t *)0x0) {
      json_local = (char *)ps_config_init((ps_arg_t *)0x0);
      if ((ps_config_t *)json_local == (ps_config_t *)0x0) {
        return (ps_config_t *)0x0;
      }
      bVar1 = true;
    }
    jsmn_init((jsmn_parser *)((long)&tokens + 4));
    sVar3 = strlen((char *)parser._4_8_);
    num_tokens = jsmn_parse((jsmn_parser *)((long)&tokens + 4),(char *)parser._4_8_,(long)(int)sVar3
                            ,(jsmntok_t *)0x0,0);
    if ((int)num_tokens < 1) {
      json_error(num_tokens);
    }
    else {
      jsmn_init((jsmn_parser *)((long)&tokens + 4));
      key = (char *)__ckd_calloc__((long)(int)num_tokens,0x10,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                                   ,0xf2);
      uVar2 = jsmn_parse((jsmn_parser *)((long)&tokens + 4),(char *)parser._4_8_,(long)(int)sVar3,
                         (jsmntok_t *)key,num_tokens);
      if (uVar2 == num_tokens) {
        ntok = (int)(((jsmntok_t *)key)->type == JSMN_OBJECT);
        while( true ) {
          _jslen = (char *)0x0;
          if ((int)num_tokens <= ntok) {
            ckd_free((void *)0x0);
            ckd_free((void *)0x0);
            ckd_free(key);
            return (ps_config_t *)json_local;
          }
          val = (char *)__ckd_malloc__((long)((((jsmntok_t *)((long)key + (long)ntok * 0x10))->end -
                                              ((jsmntok_t *)((long)key + (long)ntok * 0x10))->start)
                                             + 1),
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                                       ,0xfc);
          unescape(val,(char *)(parser._4_8_ +
                               (long)((jsmntok_t *)((long)key + (long)ntok * 0x10))->start),
                   (long)(((jsmntok_t *)((long)key + (long)ntok * 0x10))->end -
                         ((jsmntok_t *)((long)key + (long)ntok * 0x10))->start));
          if ((((jsmntok_t *)((long)key + (long)ntok * 0x10))->type != JSMN_STRING) &&
             (((jsmntok_t *)((long)key + (long)ntok * 0x10))->type != JSMN_PRIMITIVE)) break;
          uVar2 = ntok + 1;
          if (uVar2 == num_tokens) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                    ,0x103,"Missing value for %s\n",val);
            goto LAB_0010a008;
          }
          _jslen = (char *)__ckd_malloc__((long)((((jsmntok_t *)
                                                  ((long)key + (long)(int)uVar2 * 0x10))->end -
                                                 ((jsmntok_t *)((long)key + (long)(int)uVar2 * 0x10)
                                                 )->start) + 1),
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                                          ,0x106);
          unescape(_jslen,(char *)(parser._4_8_ +
                                  (long)((jsmntok_t *)((long)key + (long)(int)uVar2 * 0x10))->start)
                   ,(long)(((jsmntok_t *)((long)key + (long)(int)uVar2 * 0x10))->end -
                          ((jsmntok_t *)((long)key + (long)(int)uVar2 * 0x10))->start));
          paVar4 = ps_config_set_str((ps_config_t *)json_local,val,_jslen);
          if (paVar4 == (anytype_t *)0x0) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                    ,0x109,"Unknown or invalid parameter %s\n",val);
            goto LAB_0010a008;
          }
          ckd_free(val);
          ckd_free(_jslen);
          ntok = ntok + 2;
        }
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                ,0xff,"Expected string or primitive key, got %s\n",val);
      }
      else {
        json_error(uVar2);
      }
    }
LAB_0010a008:
    if (val != (char *)0x0) {
      ckd_free(val);
    }
    if (_jslen != (char *)0x0) {
      ckd_free(_jslen);
    }
    if (key != (char *)0x0) {
      ckd_free(key);
    }
    if (bVar1) {
      ps_config_free((ps_config_t *)json_local);
    }
  }
  return (ps_config_t *)0x0;
}

Assistant:

ps_config_t *
ps_config_parse_json(ps_config_t *config,
                     const char *json)
{
    jsmn_parser parser;
    jsmntok_t *tokens = NULL;
    char *key = NULL, *val = NULL;
    int i, jslen, ntok, new_config = FALSE;

    if (json == NULL)
        return NULL;
    if (config == NULL) {
        if ((config = ps_config_init(NULL)) == NULL)
            return NULL;
        new_config = TRUE;
    }
    jsmn_init(&parser);
    jslen = strlen(json);
    if ((ntok = jsmn_parse(&parser, json, jslen, NULL, 0)) <= 0) {
        json_error(ntok);
        goto error_out;
    }
    /* Need to reset the parser before second pass! */
    jsmn_init(&parser);
    tokens = ckd_calloc(ntok, sizeof(*tokens));
    if ((i = jsmn_parse(&parser, json, jslen, tokens, ntok)) != ntok) {
        json_error(i);
        goto error_out;
    }
    /* Accept missing top-level object. */
    i = 0;
    if (tokens[0].type == JSMN_OBJECT)
        ++i;
    while (i < ntok) {
        key = ckd_malloc(tokens[i].end - tokens[i].start + 1);
        unescape(key, json + tokens[i].start, tokens[i].end - tokens[i].start);
        if (tokens[i].type != JSMN_STRING && tokens[i].type != JSMN_PRIMITIVE) {
            E_ERROR("Expected string or primitive key, got %s\n", key);
            goto error_out;
        }
        if (++i == ntok) {
            E_ERROR("Missing value for %s\n", key);
            goto error_out;
        }
        val = ckd_malloc(tokens[i].end - tokens[i].start + 1);
        unescape(val, json + tokens[i].start, tokens[i].end - tokens[i].start);
        if (ps_config_set_str(config, key, val) == NULL) {
            E_ERROR("Unknown or invalid parameter %s\n", key);
            goto error_out;
        }
        ckd_free(key);
        ckd_free(val);
        key = val = NULL;
        ++i;
    }

    ckd_free(key);
    ckd_free(val);
    ckd_free(tokens);
    return config;

error_out:
    if (key)
        ckd_free(key);
    if (val)
        ckd_free(val);
    if (tokens)
        ckd_free(tokens);
    if (new_config)
        ps_config_free(config);
    return NULL;
}